

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O2

int anon_unknown.dwarf_7353::RtMidi_seterrorcallback(lua_State *L)

{
  int iVar1;
  mapped_type mVar2;
  RtMidi *midi;
  mapped_type *pmVar3;
  iterator iVar4;
  int index;
  key_type local_38;
  
  midi = getRtMidi(L,1);
  iVar1 = lua_type(L,2);
  if (iVar1 < 1) {
    RtMidi_init(midi,L,index);
  }
  else {
    lua_pushvalue(L,2);
    lua_pushvalue(L,3);
    lua_pushcclosure(L,RtMidi_callbackwrapper,2);
    mVar2 = luaL_ref(L,0xfff0b9d8);
    local_38.first = midi;
    local_38.second = L;
    pmVar3 = std::
             map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
             ::operator[]((map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
                           *)(anonymous_namespace)::RtMidi_callbacks,&local_38);
    *pmVar3 = mVar2;
    local_38.first = midi;
    local_38.second = L;
    iVar4 = std::
            _Rb_tree<std::pair<RtMidi_*,_lua_State_*>,_std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
            ::find((_Rb_tree<std::pair<RtMidi_*,_lua_State_*>,_std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>,_std::_Select1st<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
                    *)(anonymous_namespace)::RtMidi_callbacks,&local_38);
    (*midi->_vptr_RtMidi[6])(midi,RtMidiCustomErrorCallback,iVar4._M_node + 1);
  }
  return 0;
}

Assistant:

int RtMidi_seterrorcallback(lua_State *L) {
	auto &self = getRtMidi(L, 1);
	if (lua_isnoneornil(L, 2))
		RtMidi_init(self, L, 1);
	else {
		lua_pushvalue(L, 2);
		lua_pushvalue(L, 3);
		lua_pushcclosure(L, RtMidi_callbackwrapper, 2);
		RtMidi_callbacks[{&self, L}] = luaL_ref(L, LUA_REGISTRYINDEX);
		auto it = RtMidi_callbacks.find({&self, L});
		self.setErrorCallback(RtMidiCustomErrorCallback,
		 static_cast<void *>(const_cast<RtMidi_callback_rec *>(&it->first)));

//		lua_pushlightuserdata(L, &REGISTRY_CALLBACK_ENABLED);
//		lua_rawget(L, LUA_REGISTRYINDEX);
//		lua_pushvalue(L, 1);
//		lua_pushboolean(L, true);
//		lua_rawset(L, -3);
//		lua_pop(L, 1);
	}
	return 0;
}